

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createCompositeConstruct(Builder *this,Id typeId,Vector<Id> *constituents)

{
  uint *puVar1;
  pointer ppIVar2;
  pointer puVar3;
  int iVar4;
  Id IVar5;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  uint *puVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  int c;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  
  if ((2 < (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode - OpTypeArray) &&
     ((iVar4 = getNumTypeConstituents(this,typeId), iVar4 < 2 ||
      (iVar4 = getNumTypeConstituents(this,typeId),
      iVar4 != (int)((ulong)((long)(constituents->
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(constituents->
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 2))))) {
    __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x7be,
                  "Id spv::Builder::createCompositeConstruct(Id, const dxil_spv::Vector<Id> &)");
  }
  if (this->generatingOpCodeForSpecConst != true) {
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         dxil_spv::allocate_in_thread(0x38);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001e31e0;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar5;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
         OpCompositeConstruct;
    (((Vector<Id> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
    for (lVar7 = 0;
        puVar3 = (constituents->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)(constituents->
                                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2
                     ); lVar7 = lVar7 + 1) {
      Instruction::addIdOperand
                ((Instruction *)
                 this_00.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,puVar3[lVar7]);
    }
    local_30._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    Block::addInstruction
              (this->buildPoint,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_30._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_30._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    return *(Id *)((long)this_00.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  }
  puVar6 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar1 - (long)puVar6;
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar8 = lVar7 >> 4; 0 < lVar8; lVar8 = lVar8 + -1) {
    puVar9 = puVar6;
    if (ppIVar2[*puVar6]->opCode - OpSpecConstantTrue < 5) goto LAB_0019b4be;
    if (ppIVar2[puVar6[1]]->opCode - OpSpecConstantTrue < 5) {
      puVar9 = puVar6 + 1;
      goto LAB_0019b4be;
    }
    if (ppIVar2[puVar6[2]]->opCode - OpSpecConstantTrue < 5) {
      puVar9 = puVar6 + 2;
      goto LAB_0019b4be;
    }
    if (ppIVar2[puVar6[3]]->opCode - OpSpecConstantTrue < 5) {
      puVar9 = puVar6 + 3;
      goto LAB_0019b4be;
    }
    puVar6 = puVar6 + 4;
    lVar7 = lVar7 + -0x10;
  }
  lVar7 = lVar7 >> 2;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      puVar9 = puVar1;
      if ((lVar7 != 3) || (puVar9 = puVar6, ppIVar2[*puVar6]->opCode - OpSpecConstantTrue < 5))
      goto LAB_0019b4be;
      puVar6 = puVar6 + 1;
    }
    puVar9 = puVar6;
    if (ppIVar2[*puVar6]->opCode - OpSpecConstantTrue < 5) goto LAB_0019b4be;
    puVar6 = puVar6 + 1;
  }
  puVar9 = puVar6;
  if (4 < ppIVar2[*puVar6]->opCode - OpSpecConstantTrue) {
    puVar9 = puVar1;
  }
LAB_0019b4be:
  IVar5 = makeCompositeConstant(this,typeId,constituents,puVar9 != puVar1);
  return IVar5;
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const dxil_spv::Vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size()));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    Instruction* op = new Instruction(getUniqueId(), typeId, OpCompositeConstruct);
    for (int c = 0; c < (int)constituents.size(); ++c)
        op->addIdOperand(constituents[c]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}